

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::CloseCurrentPopup(void)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  int i;
  ImGuiPopupRef *pIVar3;
  bool bVar4;
  ImGuiWindow *window;
  int popup_idx;
  ImGuiContext *g;
  undefined1 in_stack_fffffffffffffff3;
  
  pIVar2 = GImGui;
  i = (GImGui->BeginPopupStack).Size + -1;
  if ((-1 < i) && (i < (GImGui->OpenPopupStack).Size)) {
    pIVar3 = ImVector<ImGuiPopupRef>::operator[](&GImGui->BeginPopupStack,i);
    IVar1 = pIVar3->PopupId;
    pIVar3 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,i);
    if (IVar1 == pIVar3->PopupId) {
      while( true ) {
        bVar4 = false;
        if (0 < i) {
          pIVar3 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,i);
          bVar4 = false;
          if (pIVar3->Window != (ImGuiWindow *)0x0) {
            pIVar3 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,i);
            bVar4 = (pIVar3->Window->Flags & 0x10000000U) != 0;
          }
        }
        if (!bVar4) break;
        i = i + -1;
      }
      ClosePopupToLevel(i,(bool)in_stack_fffffffffffffff3);
      if (pIVar2->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar2->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;
    while (popup_idx > 0 && g.OpenPopupStack[popup_idx].Window && (g.OpenPopupStack[popup_idx].Window->Flags & ImGuiWindowFlags_ChildMenu))
        popup_idx--;
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}